

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcSlab::IfcSlab(IfcSlab *this)

{
  *(undefined ***)&this->field_0x180 = &PTR__Object_007331c0;
  *(undefined8 *)&this->field_0x188 = 0;
  *(char **)&this->field_0x190 = "IfcSlab";
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__007de6a8);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x7de578;
  *(undefined8 *)&this->field_0x180 = 0x7de690;
  *(undefined8 *)&this->field_0x88 = 0x7de5a0;
  *(undefined8 *)&this->field_0x98 = 0x7de5c8;
  *(undefined8 *)&this->field_0xd0 = 0x7de5f0;
  *(undefined8 *)&this->field_0x100 = 0x7de618;
  *(undefined8 *)&this->field_0x138 = 0x7de640;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x7de668;
  *(undefined1 **)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>).field_0x20;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>).field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>).field_0x20 = 0;
  this->field_0x178 = 0;
  return;
}

Assistant:

IfcSlab() : Object("IfcSlab") {}